

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,string *settingsFileName,string *fallbackSettingsFileName)

{
  bool bVar1;
  ostream *poVar2;
  cmValue cVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  RegularExpression *this_00;
  pointer s;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  string_view value_07;
  string_view value_08;
  string_view value_09;
  string_view arg;
  string ignoreTargetsRegexes;
  undefined1 local_18b0 [8];
  RegularExpression currentRegex;
  string inFileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator ggi;
  
  cmake::cmake(&cm,RoleScript,Unknown,Normal);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&ggi);
  cmake::SetHomeDirectory(&cm,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&ggi);
  cmake::SetHomeOutputDirectory(&cm,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)cm.CurrentSnapshot.Position.Position;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)cm.CurrentSnapshot.State;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = (size_t)cm.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&mf);
  cmGlobalGenerator::cmGlobalGenerator(&ggi,&cm);
  currentRegex.regmatch.startp[2] = (char *)cm.CurrentSnapshot.Position.Position;
  currentRegex.regmatch.startp[0] = (char *)cm.CurrentSnapshot.State;
  currentRegex.regmatch.startp[1] = (char *)cm.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile(&mf,&ggi,(cmStateSnapshot *)&currentRegex);
  cmGlobalGenerator::CreateLocalGenerator((cmGlobalGenerator *)local_18b0,(cmMakefile *)&ggi);
  std::__cxx11::string::string((string *)&inFileName,(string *)settingsFileName);
  bVar1 = cmsys::SystemTools::FileExists(&inFileName);
  if (!bVar1) {
    std::__cxx11::string::_M_assign((string *)&inFileName);
    bVar1 = cmsys::SystemTools::FileExists(&inFileName);
    if (!bVar1) goto LAB_0037f9f1;
  }
  bVar1 = cmMakefile::ReadListFile(&mf,&inFileName);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Reading GraphViz options file: ");
    poVar2 = std::operator<<(poVar2,(string *)&inFileName);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_GRAPH_NAME",
               (allocator<char> *)&ignoreTargetsRegexes);
    cVar3 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (cVar3.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->GraphName);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_GRAPH_HEADER",
               (allocator<char> *)&ignoreTargetsRegexes);
    cVar3 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (cVar3.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->GraphHeader);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_NODE_PREFIX",
               (allocator<char> *)&ignoreTargetsRegexes);
    cVar3 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (cVar3.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->GraphNodePrefix);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_EXECUTABLES",
               (allocator<char> *)&ignoreTargetsRegexes);
    cVar3 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (cVar3.Value != (string *)0x0) {
      value._M_str = extraout_RDX;
      value._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
      bVar1 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value);
      this->GenerateForExecutables = bVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_STATIC_LIBS",
               (allocator<char> *)&ignoreTargetsRegexes);
    cVar3 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (cVar3.Value != (string *)0x0) {
      value_00._M_str = extraout_RDX_00;
      value_00._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
      bVar1 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value_00);
      this->GenerateForStaticLibs = bVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_SHARED_LIBS",
               (allocator<char> *)&ignoreTargetsRegexes);
    cVar3 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (cVar3.Value != (string *)0x0) {
      value_01._M_str = extraout_RDX_01;
      value_01._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
      bVar1 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value_01);
      this->GenerateForSharedLibs = bVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_MODULE_LIBS",
               (allocator<char> *)&ignoreTargetsRegexes);
    cVar3 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (cVar3.Value != (string *)0x0) {
      value_02._M_str = extraout_RDX_02;
      value_02._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
      bVar1 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value_02);
      this->GenerateForModuleLibs = bVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_INTERFACE_LIBS",
               (allocator<char> *)&ignoreTargetsRegexes);
    cVar3 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (cVar3.Value != (string *)0x0) {
      value_03._M_str = extraout_RDX_03;
      value_03._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
      bVar1 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value_03);
      this->GenerateForInterfaceLibs = bVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_OBJECT_LIBS",
               (allocator<char> *)&ignoreTargetsRegexes);
    cVar3 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (cVar3.Value != (string *)0x0) {
      value_04._M_str = extraout_RDX_04;
      value_04._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
      bVar1 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value_04);
      this->GenerateForObjectLibs = bVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_UNKNOWN_LIBS",
               (allocator<char> *)&ignoreTargetsRegexes);
    cVar3 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (cVar3.Value != (string *)0x0) {
      value_05._M_str = extraout_RDX_05;
      value_05._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
      bVar1 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value_05);
      this->GenerateForUnknownLibs = bVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_CUSTOM_TARGETS",
               (allocator<char> *)&ignoreTargetsRegexes);
    cVar3 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (cVar3.Value != (string *)0x0) {
      value_06._M_str = extraout_RDX_06;
      value_06._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
      bVar1 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value_06);
      this->GenerateForCustomTargets = bVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_EXTERNAL_LIBS",
               (allocator<char> *)&ignoreTargetsRegexes);
    cVar3 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (cVar3.Value != (string *)0x0) {
      value_07._M_str = extraout_RDX_07;
      value_07._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
      bVar1 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value_07);
      this->GenerateForExternals = bVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_GENERATE_PER_TARGET",
               (allocator<char> *)&ignoreTargetsRegexes);
    cVar3 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (cVar3.Value != (string *)0x0) {
      value_08._M_str = extraout_RDX_08;
      value_08._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
      bVar1 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value_08);
      this->GeneratePerTarget = bVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_GENERATE_DEPENDERS",
               (allocator<char> *)&ignoreTargetsRegexes);
    cVar3 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (cVar3.Value != (string *)0x0) {
      value_09._M_str = extraout_RDX_09;
      value_09._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
      bVar1 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value_09);
      this->GenerateDependers = bVar1;
    }
    ignoreTargetsRegexes._M_dataplus._M_p = (pointer)&ignoreTargetsRegexes.field_2;
    ignoreTargetsRegexes._M_string_length = 0;
    ignoreTargetsRegexes.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentRegex,"GRAPHVIZ_IGNORE_TARGETS",
               (allocator<char> *)&ignoreTargetsRegExVector);
    cVar3 = cmMakefile::GetDefinition(&mf,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (cVar3.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&ignoreTargetsRegexes);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    if (ignoreTargetsRegexes._M_string_length != 0) {
      arg._M_str = ignoreTargetsRegexes._M_dataplus._M_p;
      arg._M_len = ignoreTargetsRegexes._M_string_length;
      cmExpandedList_abi_cxx11_(&ignoreTargetsRegExVector,arg,false);
      for (s = ignoreTargetsRegExVector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          s != ignoreTargetsRegExVector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
        currentRegex.regmust = (char *)0x0;
        currentRegex.program = (char *)0x0;
        currentRegex.progsize = 0;
        memset(&currentRegex,0,0xaa);
        bVar1 = cmsys::RegularExpression::compile(&currentRegex,s);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Could not compile bad regex \"");
          poVar2 = std::operator<<(poVar2,(string *)s);
          poVar2 = std::operator<<(poVar2,"\"");
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
        emplace_back<cmsys::RegularExpression>(&this->TargetsToIgnoreRegex,&currentRegex);
        cmsys::RegularExpression::~RegularExpression(&currentRegex);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ignoreTargetsRegExVector);
    }
    this_00 = (RegularExpression *)&ignoreTargetsRegexes;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &currentRegex,"Problem opening GraphViz options file: ",&inFileName);
    cmSystemTools::Error((string *)&currentRegex);
    this_00 = &currentRegex;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0037f9f1:
  std::__cxx11::string::~string((string *)&inFileName);
  if (local_18b0 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_18b0 + 8))();
  }
  cmMakefile::~cmMakefile(&mf);
  cmGlobalGenerator::~cmGlobalGenerator(&ggi);
  cmake::~cmake(&cm);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(
  const std::string& settingsFileName,
  const std::string& fallbackSettingsFileName)
{
  cmake cm(cmake::RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator ggi(&cm);
  cmMakefile mf(&ggi, cm.GetCurrentSnapshot());
  std::unique_ptr<cmLocalGenerator> lg(ggi.CreateLocalGenerator(&mf));

  std::string inFileName = settingsFileName;
  if (!cmSystemTools::FileExists(inFileName)) {
    inFileName = fallbackSettingsFileName;
    if (!cmSystemTools::FileExists(inFileName)) {
      return;
    }
  }

  if (!mf.ReadListFile(inFileName)) {
    cmSystemTools::Error("Problem opening GraphViz options file: " +
                         inFileName);
    return;
  }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define set_if_set(var, cmakeDefinition)                                      \
  do {                                                                        \
    cmValue value = mf.GetDefinition(cmakeDefinition);                        \
    if (value) {                                                              \
      (var) = *value;                                                         \
    }                                                                         \
  } while (false)

  set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define set_bool_if_set(var, cmakeDefinition)                                 \
  do {                                                                        \
    cmValue value = mf.GetDefinition(cmakeDefinition);                        \
    if (value) {                                                              \
      (var) = cmIsOn(*value);                                                 \
    }                                                                         \
  } while (false)

  set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  set_bool_if_set(this->GenerateForInterfaceLibs, "GRAPHVIZ_INTERFACE_LIBS");
  set_bool_if_set(this->GenerateForObjectLibs, "GRAPHVIZ_OBJECT_LIBS");
  set_bool_if_set(this->GenerateForUnknownLibs, "GRAPHVIZ_UNKNOWN_LIBS");
  set_bool_if_set(this->GenerateForCustomTargets, "GRAPHVIZ_CUSTOM_TARGETS");
  set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty()) {
    std::vector<std::string> ignoreTargetsRegExVector =
      cmExpandedList(ignoreTargetsRegexes);
    for (std::string const& currentRegexString : ignoreTargetsRegExVector) {
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString)) {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
      }
      this->TargetsToIgnoreRegex.push_back(std::move(currentRegex));
    }
  }
}